

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionEndStr.cpp
# Opt level: O2

void __thiscall
Hpipe::InstructionEndStr::InstructionEndStr
          (InstructionEndStr *this,Context *cx,string *var,int num_active_item,bool want_next_char)

{
  InstructionWithCode::InstructionWithCode(&this->super_InstructionWithCode,cx,num_active_item);
  (this->super_InstructionWithCode).super_Instruction._vptr_Instruction =
       (_func_int **)&PTR__InstructionEndStr_001969f0;
  std::__cxx11::string::string((string *)&this->var,(string *)var);
  this->want_next_char = want_next_char;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::erase(&(this->super_InstructionWithCode).super_Instruction.running_strs._M_t,var);
  return;
}

Assistant:

InstructionEndStr::InstructionEndStr( const Context &cx, const std::string &var, int num_active_item, bool want_next_char ) : InstructionWithCode( cx, num_active_item ), var( var ), want_next_char( want_next_char ) {
    running_strs.erase( var );
}